

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

void __thiscall GainContainer::updateGain(GainContainer *this,uint cell,PartId part,int diff)

{
  reference pvVar1;
  reference this_00;
  const_iterator cVar2;
  value_type *cell_state;
  int diff_local;
  PartId part_local;
  uint cell_local;
  GainContainer *this_local;
  
  pvVar1 = std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::
           operator[](&this->cell_states_,(ulong)cell);
  if ((pvVar1->locked & 1U) == 0) {
    this_00 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[]
                        (&this->buckets_,(ulong)part);
    cVar2 = GainBuckets::moveCell(this_00,pvVar1->gain,(pvVar1->iter)._M_node,pvVar1->gain + diff);
    (pvVar1->iter)._M_node = cVar2._M_node;
    pvVar1->gain = diff + pvVar1->gain;
  }
  return;
}

Assistant:

void GainContainer::updateGain(unsigned cell, PartId part, int diff) {
  auto &cell_state = cell_states_[cell];
  if (cell_state.locked)
    return;
  cell_state.iter =
      buckets_[part].moveCell(cell_state.gain, cell_state.iter, cell_state.gain + diff);
  cell_state.gain += diff;
}